

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O0

uint64_t celero::timer::GetSystemTime(void)

{
  uint64_t uVar1;
  duration<long,_std::ratio<1L,_1000000000L>_> local_20;
  duration<long,_std::ratio<1L,_1000000L>_> local_18;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_10;
  time_point timePoint;
  
  local_10.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  local_20.__r = (rep)std::chrono::
                      time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      ::time_since_epoch(&local_10);
  local_18.__r = (rep)std::chrono::
                      duration_cast<std::chrono::duration<long,std::ratio<1l,1000000l>>,long,std::ratio<1l,1000000000l>>
                                (&local_20);
  uVar1 = std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::count(&local_18);
  return uVar1;
}

Assistant:

uint64_t celero::timer::GetSystemTime()
{
#ifdef _WIN32
	LARGE_INTEGER timeStorage;
	QueryPerformanceCounter(&timeStorage);
	if(QPCFrequency.QuadPart != 0)
	{
		return static_cast<uint64_t>(timeStorage.QuadPart * 1000000) / static_cast<uint64_t>(QPCFrequency.QuadPart);
	}

	return 0;
#else
	auto timePoint = std::chrono::high_resolution_clock::now();
	return std::chrono::duration_cast<std::chrono::microseconds>(timePoint.time_since_epoch()).count();
#endif
}